

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeGenericClassProto::TypeGenericClassProto
          (TypeGenericClassProto *this,SynIdentifier *identifier,SynBase *source,ScopeData *scope,
          SynClassDefinition *definition)

{
  Lexeme *pLVar1;
  Lexeme *pLVar2;
  char *pcVar3;
  char *pcVar4;
  SynBase *pSVar5;
  undefined4 uVar6;
  bool bVar7;
  
  TypeBase::TypeBase(&this->super_TypeBase,0x16,identifier->name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeGenericClassProto_003e3e18;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e31e0;
  uVar6 = *(undefined4 *)&(identifier->super_SynBase).field_0xc;
  pLVar1 = (identifier->super_SynBase).begin;
  pLVar2 = (identifier->super_SynBase).end;
  pcVar3 = (identifier->super_SynBase).pos.begin;
  pcVar4 = (identifier->super_SynBase).pos.end;
  pSVar5 = (identifier->super_SynBase).next;
  (this->identifier).super_SynBase.typeID = (identifier->super_SynBase).typeID;
  *(undefined4 *)&(this->identifier).super_SynBase.field_0xc = uVar6;
  (this->identifier).super_SynBase.begin = pLVar1;
  (this->identifier).super_SynBase.end = pLVar2;
  (this->identifier).super_SynBase.pos.begin = pcVar3;
  (this->identifier).super_SynBase.pos.end = pcVar4;
  (this->identifier).super_SynBase.next = pSVar5;
  bVar7 = (identifier->super_SynBase).isInternal;
  (this->identifier).super_SynBase.listed = (identifier->super_SynBase).listed;
  (this->identifier).super_SynBase.isInternal = bVar7;
  (this->identifier).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e3198;
  pcVar3 = (identifier->name).end;
  (this->identifier).name.begin = (identifier->name).begin;
  (this->identifier).name.end = pcVar3;
  this->source = source;
  this->scope = scope;
  this->definition = definition;
  (this->instances).head = (ExprBase *)0x0;
  (this->instances).tail = (ExprBase *)0x0;
  (this->super_TypeBase).isGeneric = true;
  return;
}

Assistant:

TypeGenericClassProto(const SynIdentifier& identifier, SynBase *source, ScopeData *scope, SynClassDefinition *definition): TypeBase(myTypeID, identifier.name), identifier(identifier), source(source), scope(scope), definition(definition)
	{
		isGeneric = true;
	}